

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void compileoptionusedFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  uint uVar1;
  char *zOptName;
  
  zOptName = (char *)sqlite3ValueText(*argv,'\x01');
  if (zOptName != (char *)0x0) {
    uVar1 = sqlite3_compileoption_used(zOptName);
    pMem = context->pOut;
    if ((pMem->flags & 0x2400) != 0) {
      vdbeReleaseAndSetInt64(pMem,(ulong)uVar1);
      return;
    }
    (pMem->u).i = (ulong)uVar1;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void compileoptionusedFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zOptName;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-39564-36305 The sqlite_compileoption_used() SQL
  ** function is a wrapper around the sqlite3_compileoption_used() C/C++
  ** function.
  */
  if( (zOptName = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    sqlite3_result_int(context, sqlite3_compileoption_used(zOptName));
  }
}